

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

Test * __thiscall CppUnit::Test::findTest(Test *this,string *testName)

{
  bool bVar1;
  invalid_argument *this_00;
  Test *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Test *local_78;
  Test *mutableThis;
  TestPath path;
  string *testName_local;
  Test *this_local;
  
  path.m_tests.super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)testName;
  TestPath::TestPath((TestPath *)&mutableThis);
  local_78 = this;
  (*this->_vptr_Test[7])
            (this,path.m_tests.super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,(TestPath *)&mutableThis);
  bVar1 = TestPath::isValid((TestPath *)&mutableThis);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_108,"No test named <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path.m_tests.super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
    std::operator+(&local_e8,&local_108,"> found in test <");
    (*this->_vptr_Test[6])(&local_128);
    std::operator+(&local_c8,&local_e8,&local_128);
    std::operator+(&local_a8,&local_c8,">.");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_a8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pTVar2 = TestPath::getChildTest((TestPath *)&mutableThis);
  TestPath::~TestPath((TestPath *)&mutableThis);
  return pTVar2;
}

Assistant:

Test *
Test::findTest( const std::string &testName ) const
{
  TestPath path;
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  mutableThis->findTestPath( testName, path );
  if ( !path.isValid() )
    throw std::invalid_argument( "No test named <" + testName + "> found in test <"
                                 + getName() + ">." );
  return path.getChildTest();
}